

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int apple_no_sigpipe(int fd)

{
  int fd_local;
  
  return fd;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR apple_no_sigpipe(LIBUS_SOCKET_DESCRIPTOR fd) {
#ifdef __APPLE__
    if (fd != LIBUS_SOCKET_ERROR) {
        int no_sigpipe = 1;
        setsockopt(fd, SOL_SOCKET, SO_NOSIGPIPE, &no_sigpipe, sizeof(int));
    }
#endif
    return fd;
}